

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>::Delete
               (Type *value,Arena *arena)

{
  if (arena != (Arena *)0x0) {
    return;
  }
  google::protobuf::internal::InternalOutOfLineDeleteMessageLite(value);
  return;
}

Assistant:

static inline void Delete(Type* value, Arena* arena) {
    if (arena != nullptr) return;
#ifdef __cpp_if_constexpr
    if constexpr (std::is_base_of<MessageLite, Type>::value) {
      // Using virtual destructor to reduce generated code size that would have
      // happened otherwise due to inlined `~Type()`.
      InternalOutOfLineDeleteMessageLite(value);
    } else {
      delete value;
    }
#else
    delete value;
#endif
  }